

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O1

Result __thiscall
tonk::UDPSocket::InjectRecvfrom(UDPSocket *this,UDPAddress *addr,uint8_t *data,uint bytes)

{
  pthread_mutex_t *ppVar1;
  int iVar2;
  BufferResult BVar3;
  uint64_t receiveUsec;
  uint8_t *readBuffer;
  _func_int **pp_Var4;
  undefined4 in_register_0000000c;
  uint in_R8D;
  Locker locker;
  
  receiveUsec = siamese::GetTimeUsec();
  ppVar1 = *(pthread_mutex_t **)((long)&addr[4].impl_.data_ + 0x10);
  iVar2 = pthread_mutex_lock(ppVar1);
  if (iVar2 == 0) {
    readBuffer = pktalloc::Allocator::Allocate((Allocator *)&ppVar1[1].__data,in_R8D);
    if (ppVar1 != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(ppVar1);
    }
    if (readBuffer == (uint8_t *)0x0) {
      pp_Var4 = (_func_int **)operator_new(0x38);
      *pp_Var4 = (_func_int *)"Out of memory";
      pp_Var4[1] = (_func_int *)(pp_Var4 + 3);
      pp_Var4[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var4 + 3) = 0;
      *(undefined4 *)(pp_Var4 + 5) = 0;
      pp_Var4[6] = (_func_int *)0x10;
      (this->super_IUDPSender)._vptr_IUDPSender = pp_Var4;
    }
    else {
      memcpy(readBuffer,(void *)CONCAT44(in_register_0000000c,bytes),(ulong)in_R8D);
      BVar3 = onUDPDatagram((UDPSocket *)addr,receiveUsec,(UDPAddress *)data,readBuffer,in_R8D);
      if (BVar3 != InUse) {
        ppVar1 = *(pthread_mutex_t **)((long)&addr[4].impl_.data_ + 0x10);
        iVar2 = pthread_mutex_lock(ppVar1);
        if (iVar2 != 0) goto LAB_00134b26;
        pktalloc::Allocator::Free((Allocator *)&ppVar1[1].__data,readBuffer);
        if (ppVar1 != (pthread_mutex_t *)0x0) {
          pthread_mutex_unlock(ppVar1);
        }
      }
      (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)0x0;
    }
    return (Result)(ErrorResult *)this;
  }
LAB_00134b26:
  std::__throw_system_error(iVar2);
}

Assistant:

Result UDPSocket::InjectRecvfrom(
    const UDPAddress& addr,
    const uint8_t* data,
    unsigned bytes)
{
    // Grab the receive timestamp right away
    const uint64_t receiveUsec = siamese::GetTimeUsec();

    uint8_t* buffer = Deps.ReadBufferAllocator->Allocate(bytes);
    if (!buffer) {
        return Result::OutOfMemory();
    }
    memcpy(buffer, data, bytes);

    const BufferResult result = onUDPDatagram(receiveUsec, addr, buffer, bytes);
    if (result == BufferResult::Free) {
        Deps.ReadBufferAllocator->Free(buffer);
    }

    return Result::Success();
}